

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

void __thiscall
FCompressedFile::FCompressedFile
          (FCompressedFile *this,FILE *file,EOpenMode mode,bool dontCompress,bool postopen)

{
  bool postopen_local;
  bool dontCompress_local;
  EOpenMode mode_local;
  FILE *file_local;
  FCompressedFile *this_local;
  
  FFile::FFile(&this->super_FFile);
  (this->super_FFile)._vptr_FFile = (_func_int **)&PTR__FCompressedFile_00b6bc28;
  BeEmpty(this);
  this->m_Mode = mode;
  this->m_File = file;
  this->m_NoCompress = dontCompress;
  if (postopen) {
    PostOpen(this);
  }
  return;
}

Assistant:

FCompressedFile::FCompressedFile (FILE *file, EOpenMode mode, bool dontCompress, bool postopen)
{
	BeEmpty ();
	m_Mode = mode;
	m_File = file;
	m_NoCompress = dontCompress;
	if (postopen)
	{
		PostOpen ();
	}
}